

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int.hpp
# Opt level: O1

int msgpack::v1::type::detail::convert_integer_sign<int,_true>::convert(object *o)

{
  object_type oVar1;
  undefined8 *puVar2;
  
  oVar1 = (o->super_object).type;
  if (oVar1 == NEGATIVE_INTEGER) {
    if (-0x80000001 < (o->super_object).via.i64) goto LAB_00150533;
  }
  else if ((oVar1 == POSITIVE_INTEGER) && ((o->super_object).via.u64 >> 0x1f == 0)) {
LAB_00150533:
    return (o->super_object).via.array.size;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__bad_cast_001689c8;
  __cxa_throw(puVar2,&type_error::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

static T convert(msgpack::object const& o) {
        if(o.type == msgpack::type::POSITIVE_INTEGER) {
            if(o.via.u64 > static_cast<uint64_t>(std::numeric_limits<T>::max()))
            { throw msgpack::type_error(); }
            return static_cast<T>(o.via.u64);
        } else if(o.type == msgpack::type::NEGATIVE_INTEGER) {
            if(o.via.i64 < static_cast<int64_t>(std::numeric_limits<T>::min()))
            { throw msgpack::type_error(); }
            return static_cast<T>(o.via.i64);
        }
        throw msgpack::type_error();
    }